

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char c;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  bool bVar5;
  App *pAVar6;
  IncorrectConstruction *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  App_p subcom;
  App *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  undefined1 local_c0 [64];
  string local_80;
  App_p local_60;
  _Any_data local_50;
  _Any_data local_40;
  
  if (subcommand_name->_M_string_length != 0) {
    bVar4 = detail::valid_first_char<char>(*(subcommand_name->_M_dataplus)._M_p);
    if (bVar4) {
      local_c0._48_8_ = subcommand_name;
      local_c0._56_8_ = this;
      ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)subcommand_name);
      _Var3._M_pi = _Stack_c8._M_pi;
      pAVar6 = local_d0;
      bVar4 = _Stack_c8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (!bVar4) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          c = *(char *)((long)&p_Var7->_vptr__Sp_counted_base + (long)&pAVar6->_vptr_App);
          bVar5 = detail::valid_first_char<char>(c);
          if (!bVar5 && 1 < (byte)(c - 0x2dU)) break;
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var7->_vptr__Sp_counted_base + 1);
          bVar4 = _Var3._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7;
        } while (!bVar4);
      }
      this = (App *)local_c0._56_8_;
      if (local_d0 != (App *)local_c0) {
        operator_delete(local_d0,local_c0._0_8_ + 1);
      }
      subcommand_name = (string *)local_c0._48_8_;
      if (bVar4) goto LAB_0011692b;
    }
    this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    local_50._M_unused._M_object = &local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"subcommand name is not valid","");
    IncorrectConstruction::IncorrectConstruction(this_00,(string *)&local_50);
    __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
  }
LAB_0011692b:
  local_d0 = (App *)operator_new(800);
  local_c0._16_8_ = (subcommand_description->_M_dataplus)._M_p;
  paVar1 = &subcommand_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._16_8_ == paVar1) {
    local_c0._32_8_ = paVar1->_M_allocated_capacity;
    local_c0._40_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 8);
    local_c0._44_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 0xc);
    local_c0._16_8_ = local_c0 + 0x20;
  }
  else {
    local_c0._32_8_ = paVar1->_M_allocated_capacity;
  }
  local_c0._24_8_ = subcommand_description->_M_string_length;
  (subcommand_description->_M_dataplus)._M_p = (pointer)paVar1;
  subcommand_description->_M_string_length = 0;
  (subcommand_description->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (subcommand_name->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = local_c0 + 0x50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_c0 + 0x40),pcVar2,pcVar2 + subcommand_name->_M_string_length);
  App(local_d0,(string *)(local_c0 + 0x10),(string *)(local_c0 + 0x40),this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::App*>(&_Stack_c8,local_d0);
  if (local_80._M_dataplus._M_p != local_c0 + 0x50) {
    operator_delete(local_80._M_dataplus._M_p,(ulong)(local_80.field_2._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_c0._16_8_ != local_c0 + 0x20) {
    operator_delete((void *)local_c0._16_8_,local_c0._32_8_ + 1);
  }
  local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d0;
  local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_c8._M_pi;
  local_d0 = (App *)0x0;
  _Stack_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pAVar6 = add_subcommand(this,(App_p *)(local_c0 + 0x60));
  if (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_c8._M_pi);
  }
  return pAVar6;
}

Assistant:

App *add_subcommand(std::string subcommand_name = "", std::string subcommand_description = "") {
        if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
            throw IncorrectConstruction("subcommand name is not valid");
        }
        CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
        return add_subcommand(std::move(subcom));
    }